

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileManager.cpp
# Opt level: O0

uint64_t swapEndianness64(uint64_t value)

{
  uint64_t value_local;
  
  return value << 0x38 | (value & 0xff00) << 0x28 | (value & 0xff0000) << 0x18 |
         (value & 0xff000000) << 8 | (value & 0xff00000000) >> 8 | (value & 0xff0000000000) >> 0x18
         | (value & 0xff000000000000) >> 0x28 | value >> 0x38;
}

Assistant:

inline uint64_t swapEndianness64(uint64_t value)
{
	return ((value & 0xFF) << 56) | ((value & 0xFF00) << 40) | ((value & 0xFF0000) << 24) | ((value & 0xFF000000) << 8) |
	((value & 0xFF00000000) >> 8) | ((value & 0xFF0000000000) >> 24) |
	((value & 0xFF000000000000) >> 40) | ((value & 0xFF00000000000000) >> 56);
}